

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O1

NodeAttributeNamespaceInfo * __thiscall
libcellml::attributeNamespaces_abi_cxx11_
          (NodeAttributeNamespaceInfo *__return_storage_ptr__,libcellml *this,XmlNodePtr *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type sVar4;
  XmlAttributePtr tempAttribute;
  XmlNode local_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_188;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  XmlNode::firstAttribute(&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.mPimpl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar1 = &local_d8.field_2;
    paVar2 = &local_118.field_2;
    paVar3 = &local_f8.field_2;
    do {
      XmlAttribute::namespacePrefix_abi_cxx11_(&local_d8,(XmlAttribute *)local_190.mPimpl);
      sVar4 = local_d8._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        XmlNode::name_abi_cxx11_(&local_f8,*(XmlNode **)this);
        XmlAttribute::name_abi_cxx11_(&local_138,(XmlAttribute *)local_190.mPimpl);
        XmlAttribute::namespacePrefix_abi_cxx11_(&local_158,(XmlAttribute *)local_190.mPimpl);
        XmlAttribute::namespaceUri_abi_cxx11_(&local_178,(XmlAttribute *)local_190.mPimpl);
        XmlNode::namespaceUri_abi_cxx11_(&local_118,*(XmlNode **)this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == paVar2) {
          local_d8.field_2._8_8_ = local_118.field_2._8_8_;
          local_d8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_d8._M_dataplus._M_p = local_118._M_dataplus._M_p;
        }
        local_d8.field_2._M_allocated_capacity._1_7_ = local_118.field_2._M_allocated_capacity._1_7_
        ;
        local_d8.field_2._M_local_buf[0] = local_118.field_2._M_local_buf[0];
        local_d8._M_string_length = local_118._M_string_length;
        local_118._M_string_length = 0;
        local_118.field_2._M_local_buf[0] = '\0';
        local_b8 = &local_a8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p == &local_178.field_2) {
          local_a8._8_8_ = local_178.field_2._8_8_;
        }
        else {
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_178._M_dataplus._M_p;
        }
        local_a8._M_allocated_capacity._1_7_ = local_178.field_2._M_allocated_capacity._1_7_;
        local_a8._M_local_buf[0] = local_178.field_2._M_local_buf[0];
        local_b0 = local_178._M_string_length;
        local_178._M_string_length = 0;
        local_178.field_2._M_local_buf[0] = '\0';
        local_98 = &local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p == &local_158.field_2) {
          local_88._8_8_ = local_158.field_2._8_8_;
        }
        else {
          local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_158._M_dataplus._M_p;
        }
        local_88._M_allocated_capacity._1_7_ = local_158.field_2._M_allocated_capacity._1_7_;
        local_88._M_local_buf[0] = local_158.field_2._M_local_buf[0];
        local_58 = &local_48;
        local_90 = local_158._M_string_length;
        local_158._M_string_length = 0;
        local_158.field_2._M_local_buf[0] = '\0';
        local_78 = &local_68;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p == &local_138.field_2) {
          local_68._8_8_ = local_138.field_2._8_8_;
        }
        else {
          local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_138._M_dataplus._M_p;
        }
        local_68._M_allocated_capacity._1_7_ = local_138.field_2._M_allocated_capacity._1_7_;
        local_68._M_local_buf[0] = local_138.field_2._M_local_buf[0];
        local_70 = local_138._M_string_length;
        local_138._M_string_length = 0;
        local_138.field_2._M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p == paVar3) {
          local_48._8_8_ = local_f8.field_2._8_8_;
        }
        else {
          local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_f8._M_dataplus._M_p;
        }
        local_48._M_allocated_capacity._1_7_ = local_f8.field_2._M_allocated_capacity._1_7_;
        local_48._M_local_buf[0] = local_f8.field_2._M_local_buf[0];
        local_50 = local_f8._M_string_length;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        local_118._M_dataplus._M_p = (pointer)paVar2;
        local_f8._M_dataplus._M_p = (pointer)paVar3;
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::
        emplace_back<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>
                  (local_180,
                   (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8);
        if (local_58 != &local_48) {
          operator_delete(local_58,local_48._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68._M_allocated_capacity + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88._M_allocated_capacity + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                   local_178.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                   local_158.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar3) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
      }
      XmlAttribute::next((XmlAttribute *)&local_d8);
      sVar4 = local_d8._M_string_length;
      local_190.mPimpl = (XmlNodeImpl *)local_d8._M_dataplus._M_p;
      this_00 = p_Stack_188;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      p_Stack_188 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_190.mPimpl !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  if (p_Stack_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_188);
  }
  return (NodeAttributeNamespaceInfo *)local_180;
}

Assistant:

NodeAttributeNamespaceInfo attributeNamespaces(const XmlNodePtr &node)
{
    NodeAttributeNamespaceInfo namespaceMap;
    auto tempAttribute = node->firstAttribute();
    while (tempAttribute != nullptr) {
        if (!tempAttribute->namespacePrefix().empty()) {
            namespaceMap.emplace_back(std::make_tuple(node->name(), tempAttribute->name(), tempAttribute->namespacePrefix(), tempAttribute->namespaceUri(), node->namespaceUri()));
        }
        tempAttribute = tempAttribute->next();
    }
    return namespaceMap;
}